

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_astar.hpp
# Opt level: O0

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
external_astar::ExternalAstar<Tiles>::search(ExternalAstar<Tiles> *this,State *init)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Node<Tiles> *in_RSI;
  Node<Tiles> *in_RDI;
  OpenListEmpty *e;
  Edge<Tiles> e_1;
  int op;
  int i;
  State parent_state;
  Node<Tiles> parent;
  State state;
  Node<Tiles> n;
  State *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  PackedState in_stack_fffffffffffffee0;
  PackedState s;
  Node<Tiles> *p;
  ExternalAstar<Tiles> *this_00;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *in_stack_ffffffffffffff18;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *in_stack_ffffffffffffff20;
  Node<Tiles> *in_stack_ffffffffffffff38;
  ExternalAstarOpenList<Node<Tiles>_> *in_stack_ffffffffffffff40;
  int local_ac;
  ExternalAstarOpenList<Node<Tiles>_> *in_stack_ffffffffffffff60;
  State local_66;
  char cStack_46;
  undefined8 local_48;
  PackedState local_40;
  PackedState local_38 [7];
  
  this_00 = (ExternalAstar<Tiles> *)&in_RSI[1].packed;
  p = in_RDI;
  wrap(this_00,(State *)in_RSI,in_RDI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  ExternalAstarOpenList<Node<Tiles>_>::push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  while( true ) {
    sVar3 = std::vector<Tiles::State,_std::allocator<Tiles::State>_>::size
                      ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)
                       &in_RSI[4].parent_packed);
    if (sVar3 != 0) goto LAB_0011e632;
    ExternalAstarOpenList<Node<Tiles>_>::pop(in_stack_ffffffffffffff60);
    Tiles::unpack((Tiles *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  in_stack_fffffffffffffed0,in_stack_fffffffffffffee0);
    bVar1 = Tiles::isgoal((Tiles *)(in_RSI->parent_packed).word,&local_66);
    if (bVar1) break;
    (in_RSI->packed).word = (in_RSI->packed).word + 1;
    local_ac = 0;
    while (in_stack_fffffffffffffedc = local_ac,
          iVar2 = Tiles::nops((Tiles *)(in_RSI->parent_packed).word,&local_66),
          in_stack_fffffffffffffedc < iVar2) {
      iVar2 = Tiles::nthop((Tiles *)(in_RSI->parent_packed).word,&local_66,local_ac);
      if (iVar2 != cStack_46) {
        *(long *)(in_RSI + 1) = *(long *)(in_RSI + 1) + 1;
        Tiles::apply((Tiles *)p,(State *)in_RDI,(int)(in_stack_fffffffffffffee0.word >> 0x20));
        in_stack_fffffffffffffed0 = (State *)&in_RSI[1].packed;
        wrap(this_00,(State *)in_RSI,p,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        ExternalAstarOpenList<Node<Tiles>_>::push
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        Tiles::undo((Tiles *)(in_RSI->parent_packed).word,&local_66,
                    (Edge<Tiles> *)&stack0xffffffffffffff28);
      }
      local_ac = local_ac + 1;
    }
  }
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
            ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)in_stack_fffffffffffffee0.word,
             (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = Tiles::PackedState::operator!=(local_38,&local_40), bVar1) {
    ExternalAstarOpenList<Node<Tiles>_>::trace_parent
              ((ExternalAstarOpenList<Node<Tiles>_> *)this_00,in_RSI);
    s.word = (uint64_t)&stack0xffffffffffffff66;
    Tiles::unpack((Tiles *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  in_stack_fffffffffffffed0,s);
    std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
              ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)s.word,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  ExternalAstarOpenList<Node<Tiles>_>::clear((ExternalAstarOpenList<Node<Tiles>_> *)0x11e4d8);
LAB_0011e632:
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return (vector<Tiles::State,_std::allocator<Tiles::State>_> *)p;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (path.size() == 0) {
                try {
                    Node<D> n = open.pop();

                    typename D::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<D> parent = open.trace_parent(n);
                            typename D::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        open.clear();
                        break;
                    }
                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<D> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                } catch (OpenListEmpty& e) {
                    break;
                } catch (...) {
                    throw;
                }
            }
            return path;
        }